

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void __thiscall ImGui::SFML::Shutdown(SFML *this,Window *window)

{
  long *plVar1;
  default_delete<(anonymous_namespace)::WindowContext> *this_00;
  long lVar2;
  WindowHandle WVar3;
  WindowHandle WVar4;
  WindowHandle WVar5;
  WindowHandle WVar6;
  pointer *__ptr;
  long lVar7;
  ImGuiContext *ctx;
  long *plVar8;
  long *plVar9;
  
  WVar3 = sf::Window::getSystemHandle((Window *)*(anonymous_namespace)::s_currWindowCtx);
  WVar4 = sf::Window::getSystemHandle((Window *)this);
  plVar1 = DAT_0022f120;
  lVar7 = (long)DAT_0022f120 - (long)(anonymous_namespace)::s_windowContexts >> 5;
  plVar8 = (anonymous_namespace)::s_windowContexts;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    plVar8 = (anonymous_namespace)::s_windowContexts + 2;
    do {
      plVar9 = plVar8;
      WVar5 = sf::Window::getSystemHandle(*(Window **)plVar9[-2]);
      WVar6 = sf::Window::getSystemHandle((Window *)this);
      if (WVar5 == WVar6) {
        plVar9 = plVar9 + -2;
        goto LAB_0014701c;
      }
      WVar5 = sf::Window::getSystemHandle(*(Window **)plVar9[-1]);
      WVar6 = sf::Window::getSystemHandle((Window *)this);
      if (WVar5 == WVar6) {
        plVar9 = plVar9 + -1;
        goto LAB_0014701c;
      }
      WVar5 = sf::Window::getSystemHandle(*(Window **)*plVar9);
      WVar6 = sf::Window::getSystemHandle((Window *)this);
      if (WVar5 == WVar6) goto LAB_0014701c;
      WVar5 = sf::Window::getSystemHandle(*(Window **)plVar9[1]);
      WVar6 = sf::Window::getSystemHandle((Window *)this);
      if (WVar5 == WVar6) {
        plVar9 = plVar9 + 1;
        goto LAB_0014701c;
      }
      lVar7 = lVar7 + -1;
      plVar8 = plVar9 + 4;
    } while (1 < lVar7);
    plVar8 = plVar9 + 2;
  }
  lVar7 = (long)plVar1 - (long)plVar8 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      plVar9 = plVar1;
      if (lVar7 != 3) goto LAB_0014701c;
      WVar5 = sf::Window::getSystemHandle(*(Window **)*plVar8);
      WVar6 = sf::Window::getSystemHandle((Window *)this);
      plVar9 = plVar8;
      if (WVar5 == WVar6) goto LAB_0014701c;
      plVar8 = plVar8 + 1;
    }
    WVar5 = sf::Window::getSystemHandle(*(Window **)*plVar8);
    WVar6 = sf::Window::getSystemHandle((Window *)this);
    plVar9 = plVar8;
    if (WVar5 == WVar6) goto LAB_0014701c;
    plVar8 = plVar8 + 1;
  }
  WVar5 = sf::Window::getSystemHandle(*(Window **)*plVar8);
  WVar6 = sf::Window::getSystemHandle((Window *)this);
  plVar9 = plVar8;
  if (WVar5 != WVar6) {
    plVar9 = plVar1;
  }
LAB_0014701c:
  if (plVar9 == DAT_0022f120) {
    __assert_fail("found != s_windowContexts.end() && \"Window wasn\'t inited properly: forgot to call ImGui::SFML::Init(window)?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x21b,"void ImGui::SFML::Shutdown(const sf::Window &)");
  }
  plVar9 = plVar9 + 1;
  if ((plVar9 != DAT_0022f120) && (lVar7 = (long)DAT_0022f120 - (long)plVar9 >> 3, 0 < lVar7)) {
    lVar7 = lVar7 + 1;
    do {
      this_00 = (default_delete<(anonymous_namespace)::WindowContext> *)plVar9[-1];
      lVar2 = *plVar9;
      *plVar9 = 0;
      plVar9[-1] = lVar2;
      if (this_00 != (default_delete<(anonymous_namespace)::WindowContext> *)0x0) {
        std::default_delete<(anonymous_namespace)::WindowContext>::operator()
                  (this_00,(WindowContext *)window);
      }
      plVar9 = plVar9 + 1;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  plVar1 = DAT_0022f120 + -1;
  plVar8 = DAT_0022f120 + -1;
  DAT_0022f120 = plVar1;
  if ((default_delete<(anonymous_namespace)::WindowContext> *)*plVar8 !=
      (default_delete<(anonymous_namespace)::WindowContext> *)0x0) {
    std::default_delete<(anonymous_namespace)::WindowContext>::operator()
              ((default_delete<(anonymous_namespace)::WindowContext> *)*plVar8,
               (WindowContext *)window);
  }
  *plVar1 = 0;
  if (WVar3 != WVar4) {
    return;
  }
  if ((anonymous_namespace)::s_windowContexts == DAT_0022f120) {
    (anonymous_namespace)::s_currWindowCtx = (undefined8 *)0x0;
    ctx = (ImGuiContext *)0x0;
  }
  else {
    (anonymous_namespace)::s_currWindowCtx = (undefined8 *)*(anonymous_namespace)::s_windowContexts;
    ctx = *(ImGuiContext **)((long)(anonymous_namespace)::s_currWindowCtx + 8);
  }
  SetCurrentContext(ctx);
  return;
}

Assistant:

void Shutdown(const sf::Window& window) {
    bool needReplacement = (s_currWindowCtx->window->getSystemHandle() == window.getSystemHandle());

    // remove window's context
    auto found = std::find_if(s_windowContexts.begin(), s_windowContexts.end(),
                              [&](std::unique_ptr<WindowContext>& ctx) {
                                  return ctx->window->getSystemHandle() == window.getSystemHandle();
                              });
    assert(found != s_windowContexts.end() &&
           "Window wasn't inited properly: forgot to call ImGui::SFML::Init(window)?");
    s_windowContexts.erase(found); // s_currWindowCtx can become invalid here!

    // set current context to some window for convenience if needed
    if (needReplacement) {
        auto it = s_windowContexts.begin();
        if (it != s_windowContexts.end()) {
            // set to some other window
            s_currWindowCtx = it->get();
            ImGui::SetCurrentContext(s_currWindowCtx->imContext);
        } else {
            // no alternatives...
            s_currWindowCtx = nullptr;
            ImGui::SetCurrentContext(nullptr);
        }
    }
}